

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void qclab::printMatrix4x4<qclab::dense::SquareMatrix<double>>(SquareMatrix<double> *mat)

{
  if (mat->size_ == 4) {
    print<double>(*(mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                   _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 2]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 3]);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[1]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ + 1]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 2 + 1]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 3 + 1]);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[2]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ + 2]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 2 + 2]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 3 + 2]);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[3]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ + 3]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 2 + 3]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ * 3 + 3]);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    return;
  }
  __assert_fail("mat.rows() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x6a,
                "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<double>]");
}

Assistant:

void printMatrix4x4( const T& mat ) {
    assert( mat.rows() == 4 ) ;
    assert( mat.cols() == 4 ) ;
    print( mat(0,0) ); print( mat(0,1) ); print( mat(0,2) ); print( mat(0,3) );
    std::cout << std::endl ;
    print( mat(1,0) ); print( mat(1,1) ); print( mat(1,2) ); print( mat(1,3) );
    std::cout << std::endl ;
    print( mat(2,0) ); print( mat(2,1) ); print( mat(2,2) ); print( mat(2,3) );
    std::cout << std::endl ;
    print( mat(3,0) ); print( mat(3,1) ); print( mat(3,2) ); print( mat(3,3) );
    std::cout << std::endl ;
  }